

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

ssize_t readn(int fd,string *inBuffer)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  undefined1 local_1068 [8];
  char buff [4096];
  undefined1 local_58 [16];
  string *local_48;
  long local_40;
  undefined8 local_38;
  
  local_40 = 1;
  local_48 = inBuffer;
  sVar2 = read(fd,local_1068,0x1000);
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 2;
    if (*piVar3 != 4) {
      if (*piVar3 == 0xb) {
        local_38 = 0;
        sVar4 = (*(code *)((long)&DAT_0012660c + (long)(int)(&DAT_0012660c)[local_40]))();
        return sVar4;
      }
      perror("read error");
      local_38 = 0xffffffffffffffff;
      sVar4 = (*(code *)((long)&DAT_0012660c + (long)(int)(&DAT_0012660c)[local_40]))();
      return sVar4;
    }
  }
  else if (sVar2 == 0) {
    uVar1 = 3;
  }
  else {
    buff._4088_8_ = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(buff + 0xff8),local_1068,local_1068 + sVar2);
    std::__cxx11::string::_M_append((char *)local_48,buff._4088_8_);
    if ((undefined1 *)buff._4088_8_ != local_58) {
      operator_delete((void *)buff._4088_8_);
    }
    uVar1 = 0;
  }
  sVar4 = (*(code *)((long)&DAT_0012660c + (long)(int)(&DAT_0012660c)[uVar1]))();
  return sVar4;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer) {
  ssize_t nread = 0;
  ssize_t readSum = 0;
  while (true) {
    char buff[MAX_BUFF];
    if ((nread = read(fd, buff, MAX_BUFF)) < 0) {
      if (errno == EINTR)
        continue;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        perror("read error");
        return -1;
      }
    } else if (nread == 0) {
      // printf("redsum = %d\n", readSum);
      break;
    }
    // printf("before inBuffer.size() = %d\n", inBuffer.size());
    // printf("nread = %d\n", nread);
    readSum += nread;
    // buff += nread;
    inBuffer += std::string(buff, buff + nread);
    // printf("after inBuffer.size() = %d\n", inBuffer.size());
  }
  return readSum;
}